

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O2

double calculateLogLikelihood
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *theta,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *phi,
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *frequencyMatrix,
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *docVoca)

{
  uint uVar1;
  pointer pvVar2;
  pointer pdVar3;
  long lVar4;
  pointer pvVar5;
  ulong uVar6;
  ulong uVar7;
  int l;
  ulong uVar8;
  long lVar9;
  int d;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wordProbMat;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  uVar6 = ((long)(docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(docVoca->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pvVar2 = (phi->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = *(pointer *)
            ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data + 8);
  lVar4 = *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&wordProbMat,uVar6 & 0xffffffff,(allocator_type *)&local_48);
  lVar9 = 0;
  uVar10 = 0;
  while( true ) {
    if ((ulong)(((long)wordProbMat.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)wordProbMat.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar10) break;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((wordProbMat.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar9),
               (ulong)((long)pdVar3 - lVar4) >> 3 & 0xffffffff,(value_type_conflict *)&local_48);
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x18;
  }
  dot(&local_48,theta,phi);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_move_assign(&wordProbMat,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  local_78 = 0.0;
  for (uVar10 = 0; uVar10 != (uVar6 & 0xffffffff); uVar10 = uVar10 + 1) {
    dVar12 = 0.0;
    for (uVar8 = 0;
        pvVar5 = (docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        lVar4 = *(long *)&pvVar5[uVar10].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar5[uVar10].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 2);
        uVar8 = uVar8 + 1) {
      uVar7 = (ulong)*(uint *)(lVar4 + uVar8 * 4);
      uVar1 = *(uint *)(*(long *)&(frequencyMatrix->
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data + uVar7 * 4);
      dVar11 = log(wordProbMat.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7]);
      dVar12 = dVar12 + (double)uVar1 * dVar11;
    }
    local_78 = local_78 + dVar12;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&wordProbMat);
  return local_78;
}

Assistant:

double calculateLogLikelihood(const vector<vector<double> > &theta, const vector<vector<double> > &phi, const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca){
    double logLikelihood = 0.0;
    unsigned int D=docVoca.size(), V=phi[0].size();
    vector<vector<double> > wordProbMat(D);
    for(int d=0;d<wordProbMat.size();d++)wordProbMat[d].assign(V,0);
    wordProbMat = dot(theta, phi);
    for(int d=0; d<D; d++){
        double documentLogLikelihood = 0.0;
        for(int l=0; l<docVoca[d].size(); l++){
            unsigned int m = frequencyMatrix[d][docVoca[d][l]];
            documentLogLikelihood += log(wordProbMat[d][docVoca[d][l]]) * m;
        }
        logLikelihood += documentLogLikelihood;
    }
    return logLikelihood;
}